

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O1

void std_array(void)

{
  array<int,_4UL> s;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  Assert local_1b8;
  array<int,_4UL> local_1a8;
  stringstream local_190 [16];
  ostream local_180 [112];
  ios_base local_110 [264];
  
  local_1a8._M_elems[0] = 0;
  local_1a8._M_elems[1] = 1;
  local_1a8._M_elems[2] = 2;
  local_1a8._M_elems[3] = 0x9c;
  std::__cxx11::stringstream::stringstream(local_190);
  UnitTests::stream_any_details::output_range_or_type<std::array<int,4ul>>
            (local_180,&local_1a8,(true_type *)&local_1d8);
  local_1b8.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_1b8.m_line = 0x92;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[15],std::__cxx11::string>
            (&local_1b8,(char (*) [15])"[0, 1, 2, 156]",&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

TEST(std_array)
{
    auto s  = std::array<int, 4>{0, 1, 2, 156};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[0, 1, 2, 156]", ss.str());
}